

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O3

HRESULT __thiscall
Js::DebugContext::RundownSourcesAndReparse
          (DebugContext *this,bool shouldPerformSourceRundown,bool shouldReparseFunctions)

{
  Type *alloc;
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  JavascriptLibrary *this_01;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *pUVar2;
  SRCINFO *pSVar3;
  HostDebugContext *pHVar4;
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar5;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar6;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_> *pSVar7;
  FunctionInfo *this_02;
  ScriptContext *pSVar8;
  Type pcVar9;
  code *pcVar10;
  byte bVar11;
  bool bVar12;
  int iVar13;
  Type TVar14;
  int iVar15;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *utf8SourceInfoList;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_03;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar16;
  undefined4 *puVar17;
  undefined4 extraout_var;
  SourceContextInfo *pSVar18;
  Type *pTVar19;
  ParseableFunctionInfo *pPVar20;
  FunctionBody *pFVar21;
  LPCWSTR title;
  undefined8 extraout_RAX;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar22;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *this_04;
  Type *pTVar23;
  undefined7 in_register_00000011;
  HRESULT HVar24;
  undefined7 in_register_00000031;
  long lVar25;
  ulong uVar26;
  void *unaff_retaddr;
  undefined1 local_f8 [8];
  EnterScriptObject __enterScriptObject;
  undefined1 auStack_c8 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  anon_class_8_1_79d158cc_for_mapper local_90;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *local_88;
  TempArenaAllocatorObject *local_80;
  DWORD_PTR local_78;
  long local_70;
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *local_68
  ;
  FunctionStartToYieldRegister *local_60;
  FunctionStartToYieldRegister *yieldFunctions;
  undefined4 local_50;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_2;
  HRESULT local_38;
  
  local_50 = (undefined4)CONCAT71(in_register_00000031,shouldPerformSourceRundown);
  if ((int)CONCAT71(in_register_00000011,shouldReparseFunctions) != 0) {
    this->field_0x1c = this->field_0x1c | 2;
  }
  Output::Trace(DebuggerPhase,
                L"DebugContext::RundownSourcesAndReparse scriptContext 0x%p, shouldPerformSourceRundown %d, shouldReparseFunctions %d\n"
                ,this->scriptContext,(ulong)shouldPerformSourceRundown,(ulong)shouldReparseFunctions
               );
  local_60 = (FunctionStartToYieldRegister *)0x0;
  this_01 = (JavascriptLibrary *)this->scriptContext->threadContext;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_c8,ExceptionType_OutOfMemory);
  __enterScriptObject.library = this_01;
  local_80 = ThreadContext::GetTemporaryAllocator((ThreadContext *)this_01,L"debuggerAlloc");
  utf8SourceInfoList =
       JsUtil::
       List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
       ::New(this->scriptContext->recycler,4);
  alloc = &local_80->allocator;
  this_03 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_03,alloc,0);
  local_60 = this_03;
  pLVar16 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->scriptContext->sourceList);
  iVar13 = (pLVar16->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
           ).count;
  if (0 < iVar13) {
    lVar25 = 0;
    do {
      pRVar1 = (pLVar16->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar25].ptr;
      if ((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
         && (pUVar2 = (Utf8SourceInfo *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
            pUVar2 != (Utf8SourceInfo *)0x0)) {
        WalkAndAddUtf8SourceInfo(this,pUVar2,utf8SourceInfoList);
        iVar13 = (pLVar16->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < iVar13);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_c8);
  if ((utf8SourceInfoList->
      super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).count < 1
     ) {
    local_38 = 0;
  }
  else {
    local_88 = utf8SourceInfoList;
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    bVar11 = (byte)local_50;
    local_70 = 0;
    do {
      if ((this->field_0x1c & 1) != 0) {
LAB_008a706b:
        local_38 = -0x7fffbffb;
        break;
      }
      pUVar2 = (local_88->
               super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
               buffer.ptr[local_70].ptr;
      iVar13 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
      if ((char)iVar13 != '\0') goto LAB_008a706b;
      Output::Trace(DebuggerPhase,
                    L"DebugContext::RundownSourcesAndReparse scriptContext 0x%p, sourceInfo 0x%p, HasDebugDocument %d\n"
                    ,this->scriptContext,pUVar2,
                    (ulong)((pUVar2->m_debugDocument).ptr != (DebugDocument *)0x0));
      if ((pUVar2->field_0xa8 & 4) == 0) {
        pSVar3 = (pUVar2->m_srcInfo).ptr;
        if ((pSVar3 == (SRCINFO *)0x0) ||
           ((pSVar3->sourceContextInfo).ptr == (SourceContextInfo *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar17 = 1;
          bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                       ,0xfe,
                                       "(sourceInfo->GetSrcInfo() && sourceInfo->GetSrcInfo()->sourceContextInfo)"
                                       ,
                                       "sourceInfo->GetSrcInfo() && sourceInfo->GetSrcInfo()->sourceContextInfo"
                                      );
          if (!bVar12) goto LAB_008a7248;
          *puVar17 = 0;
        }
        local_78 = 0xffffffffffffffff;
        if ((char)local_50 != '\0') {
          if ((pUVar2->m_debugDocument).ptr != (DebugDocument *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar17 = 1;
            bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                         ,0x104,"(!sourceInfo->HasDebugDocument())",
                                         "!sourceInfo->HasDebugDocument()");
            if (!bVar12) {
LAB_008a7248:
              pcVar10 = (code *)invalidInstructionException();
              (*pcVar10)();
            }
            *puVar17 = 0;
          }
          pHVar4 = this->hostDebugContext;
          if (pHVar4 != (HostDebugContext *)0x0) {
            iVar13 = (*pHVar4->_vptr_HostDebugContext[1])(pHVar4,pUVar2);
            local_78 = CONCAT44(extraout_var,iVar13);
          }
        }
        pLVar5 = (pUVar2->topLevelFunctionInfoList).ptr;
        if ((pLVar5 != (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)0x0) &&
           (local_68 = pLVar5,
           (pLVar5->super_ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer>).count
           != 0)) {
          if ((this->hostDebugContext != (HostDebugContext *)0x0) &&
             (pSVar18 = Utf8SourceInfo::GetSourceContextInfo(pUVar2),
             pSVar18 != (SourceContextInfo *)0x0)) {
            pHVar4 = this->hostDebugContext;
            pSVar18 = Utf8SourceInfo::GetSourceContextInfo(pUVar2);
            (*pHVar4->_vptr_HostDebugContext[2])(pHVar4,(pSVar18->field_5).field_0.url);
          }
          if (shouldReparseFunctions) {
            JsUtil::
            BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Clear(local_60);
            AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                      ((AutoNestedHandledExceptionType *)auStack_c8,ExceptionType_OutOfMemory);
            pSVar6 = (pUVar2->functionBodyDictionary).ptr;
            if (pSVar6 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                           *)0x0) {
              local_90.yieldFunctions = &local_60;
              TVar14 = (pSVar6->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).bucketCount;
              if (TVar14 != 0) {
                uVar26 = 0;
                do {
                  iVar13 = (pSVar6->
                           super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ).buckets.ptr[uVar26];
                  if (iVar13 != -1) {
                    do {
                      pSVar7 = (pSVar6->
                               super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               ).entries.ptr;
                      iVar15 = pSVar7[iVar13].
                               super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                               .
                               super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                               .
                               super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                               .
                               super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                               .next;
                      pFVar21 = pSVar7[iVar13].
                                super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                .
                                super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                                .
                                super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                                .
                                super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                                .value.ptr;
                      if (pFVar21 == (FunctionBody *)0x0) {
                        AssertCount = AssertCount + 1;
                        Throw::LogAssert();
                        *puVar17 = 1;
                        bVar12 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                  ,0xa2,"(functionBody)","functionBody");
                        if (!bVar12) goto LAB_008a7248;
                        *puVar17 = 0;
                        anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
                        anon_class_8_1_60afaf7f_for_fn::anon_class_8_1_79d158cc_for_mapper::
                        operator()(&local_90,(FunctionBody *)0x0);
                      }
                      else {
                        anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
                        anon_class_8_1_60afaf7f_for_fn::anon_class_8_1_79d158cc_for_mapper::
                        operator()(&local_90,pFVar21);
                      }
                      iVar13 = iVar15;
                    } while (iVar15 != -1);
                    TVar14 = (pSVar6->
                             super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             ).bucketCount;
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 < TVar14);
              }
            }
            AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                      ((AutoNestedHandledExceptionType *)auStack_c8);
          }
          if (0 < (local_68->
                  super_ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer>).count)
          {
            __autoNestedHandledExceptionType_2.savedData.handledExceptionType =
                 (Data)ExceptionType_None;
            iVar13 = 0;
            do {
              if (((this->field_0x1c & 1) != 0) ||
                 (iVar15 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo
                             [0x24])(), (char)iVar15 != '\0')) goto LAB_008a706b;
              pTVar19 = JsUtil::
                        List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        ::Item(local_68,iVar13);
              this_02 = pTVar19->ptr;
              if (this_02 != (FunctionInfo *)0x0) {
                if (shouldReparseFunctions) {
                  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                            ((AutoNestedHandledExceptionType *)((long)&yieldFunctions + 4),
                             ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                             ExceptionType_OutOfMemory);
                  pSVar8 = this->scriptContext;
                  auStack_c8 = (undefined1  [8])0x0;
                  ___autoNestedHandledExceptionType = (void *)0x0;
                  EnterScriptObject::EnterScriptObject
                            ((EnterScriptObject *)local_f8,pSVar8,
                             (ScriptEntryExitRecord *)auStack_c8,unaff_retaddr,&stack0x00000000,
                             false,false,false);
                  ScriptContext::OnScriptStart(pSVar8,false,true);
                  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_f8);
                  pPVar20 = FunctionInfo::GetParseableFunctionInfo(this_02);
                  ParseableFunctionInfo::Parse(pPVar20,(ScriptFunction **)0x0,false);
                  pFVar21 = FunctionInfo::GetFunctionBody(this_02);
                  FunctionBody::EnsureDynamicProfileInfo(pFVar21);
                  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_f8);
                  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                            ((AutoNestedHandledExceptionType *)((long)&yieldFunctions + 4));
                }
                pPVar20 = FunctionInfo::GetParseableFunctionInfo(this_02);
                if ((((byte)__autoNestedHandledExceptionType_2.savedData.handledExceptionType |
                     bVar11 ^ 1) & 1) == 0) {
                  if (((this->field_0x1c & 1) == 0) &&
                     (iVar15 = (*(this->scriptContext->super_ScriptContextInfo).
                                 _vptr_ScriptContextInfo[0x24])(), (char)iVar15 == '\0')) {
                    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                              ((AutoNestedHandledExceptionType *)auStack_c8,
                               ExceptionType_OutOfMemory);
                    title = ParseableFunctionInfo::GetSourceName(pPVar20);
                    RegisterFunction(this,pPVar20,local_78,title);
                    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                              ((AutoNestedHandledExceptionType *)auStack_c8);
                    __autoNestedHandledExceptionType_2.savedData.handledExceptionType =
                         SUB84(CONCAT71((int7)((ulong)extraout_RAX >> 8),1),0);
                  }
                  else {
                    __autoNestedHandledExceptionType_2.savedData.handledExceptionType =
                         (Data)ExceptionType_None;
                  }
                }
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (local_68->
                              super_ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer>
                              ).count);
          }
          if ((shouldReparseFunctions) &&
             (pSVar6 = (pUVar2->functionBodyDictionary).ptr,
             pSVar6 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                        *)0x0)) {
            auStack_c8 = (undefined1  [8])&local_60;
            TVar14 = (pSVar6->
                     super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ).bucketCount;
            if (TVar14 != 0) {
              uVar26 = 0;
              do {
                iVar13 = (pSVar6->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).buckets.ptr[uVar26];
                if (iVar13 != -1) {
                  do {
                    pSVar7 = (pSVar6->
                             super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             ).entries.ptr;
                    iVar15 = pSVar7[iVar13].
                             super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                             .
                             super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .next;
                    pFVar21 = pSVar7[iVar13].
                              super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                              .
                              super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                              .
                              super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                              .
                              super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                              .value.ptr;
                    if (pFVar21 == (FunctionBody *)0x0) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      *puVar17 = 1;
                      bVar12 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                  ,0xa2,"(functionBody)","functionBody");
                      if (!bVar12) goto LAB_008a7248;
                      *puVar17 = 0;
                      anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
                      anon_class_8_1_60afaf7f_for_fn::anon_class_8_1_79d158cc_for_mapper::operator()
                                ((anon_class_8_1_79d158cc_for_mapper *)auStack_c8,
                                 (FunctionBody *)0x0);
                    }
                    else {
                      anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
                      anon_class_8_1_60afaf7f_for_fn::anon_class_8_1_79d158cc_for_mapper::operator()
                                ((anon_class_8_1_79d158cc_for_mapper *)auStack_c8,pFVar21);
                    }
                    iVar13 = iVar15;
                  } while (iVar15 != -1);
                  TVar14 = (pSVar6->
                           super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ).bucketCount;
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 < TVar14);
            }
          }
        }
      }
      else if (((shouldReparseFunctions) &&
               (pSVar6 = (pUVar2->functionBodyDictionary).ptr,
               pSVar6 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                          *)0x0)) &&
              (TVar14 = (pSVar6->
                        super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ).bucketCount, TVar14 != 0)) {
        uVar26 = 0;
        do {
          iVar13 = (pSVar6->
                   super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ).buckets.ptr[uVar26];
          if (iVar13 != -1) {
            do {
              pSVar7 = (pSVar6->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).entries.ptr;
              pFVar21 = pSVar7[iVar13].
                        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .
                        super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                        .
                        super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .value.ptr;
              if (pFVar21 == (FunctionBody *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar17 = 1;
                bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                             ,0xa2,"(functionBody)","functionBody");
                if (bVar12) {
                  *puVar17 = 0;
                  ParseableFunctionInfo::IsFunctionParsed((ParseableFunctionInfo *)0x0);
                  FunctionBody::ReinitializeExecutionModeAndLimits((FunctionBody *)0x0);
                }
                goto LAB_008a7248;
              }
              iVar13 = pSVar7[iVar13].
                       super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                       .
                       super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                       .
                       super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                       .next;
              bVar12 = ParseableFunctionInfo::IsFunctionParsed
                                 (&pFVar21->super_ParseableFunctionInfo);
              if (bVar12) {
                FunctionBody::ReinitializeExecutionModeAndLimits(pFVar21);
              }
              FunctionBody::UpdateEntryPointsOnDebugReparse(pFVar21);
            } while (iVar13 != -1);
            TVar14 = (pSVar6->
                     super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ).bucketCount;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < TVar14);
      }
      local_38 = 0;
      local_70 = local_70 + 1;
    } while (local_70 <
             (local_88->
             super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
             count);
  }
  HVar24 = -0x7fffbffb;
  if ((this->field_0x1c & 1) == 0) {
    iVar13 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    HVar24 = -0x7fffbffb;
    if ((char)iVar13 == '\0') {
      HVar24 = local_38;
    }
    if (((((char)local_50 == '\x01' && (char)iVar13 == '\0') &&
         (HVar24 = local_38,
         (this->scriptContext->calleeUtf8SourceInfoList).ptr !=
         (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
          *)0x0)) &&
        (pLVar22 = Memory::
                   RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
                   ::operator->(&this->scriptContext->calleeUtf8SourceInfoList),
        (pLVar22->
        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
        ).count != 0)) &&
       ((this->hostDebugContext != (HostDebugContext *)0x0 &&
        (pSVar8 = this->scriptContext,
        (pSVar8->calleeUtf8SourceInfoList).ptr !=
        (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
         *)0x0)))) {
      this_00 = &pSVar8->calleeUtf8SourceInfoList;
      pLVar22 = Memory::
                RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
                ::operator->(this_00);
      if (((pLVar22->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
           ).count != 0) &&
         (pLVar22 = Memory::
                    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
                    ::operator->(this_00),
         0 < (pLVar22->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).count)) {
        lVar25 = 0;
        do {
          pRVar1 = (pLVar22->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr[lVar25].ptr;
          if (((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0
             ) {
            this_04 = Memory::
                      RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
                      ::operator->(this_00);
            pTVar23 = JsUtil::
                      List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                      ::Item(this_04,(int)lVar25);
            if ((((ulong)pTVar23->ptr & 1) == 0 &&
                 pTVar23->ptr != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
               ((this->field_0x1c & 1) == 0)) {
              pcVar9 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef;
              iVar13 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo
                         [0x24])();
              if ((char)iVar13 == '\0') {
                (*this->hostDebugContext->_vptr_HostDebugContext[4])(this->hostDebugContext,pcVar9);
              }
            }
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < (pLVar22->
                          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                          ).count);
      }
      if (this_00->ptr !=
          (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
           *)0x0) {
        Memory::
        RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
        ::Unroot(this_00,pSVar8->recycler);
      }
    }
  }
  ThreadContext::ReleaseTemporaryAllocator((ThreadContext *)__enterScriptObject.library,local_80);
  if (shouldReparseFunctions) {
    this->field_0x1c = this->field_0x1c & 0xfd;
  }
  return HVar24;
}

Assistant:

HRESULT DebugContext::RundownSourcesAndReparse(bool shouldPerformSourceRundown, bool shouldReparseFunctions)
    {
        struct AutoRestoreIsReparsingSource
        {
            AutoRestoreIsReparsingSource(DebugContext* debugContext, bool shouldReparseFunctions)
                : debugContext(debugContext)
                , shouldReparseFunctions(shouldReparseFunctions)
            {
                if (this->shouldReparseFunctions)
                {
                    this->debugContext->isReparsingSource = true;
                }
            }
            ~AutoRestoreIsReparsingSource()
            {
                if (this->shouldReparseFunctions)
                {
                    this->debugContext->isReparsingSource = false;
                }
            }

        private:
            DebugContext* debugContext;
            bool shouldReparseFunctions;
        } autoRestoreIsReparsingSource(this, shouldReparseFunctions);

        OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::RundownSourcesAndReparse scriptContext 0x%p, shouldPerformSourceRundown %d, shouldReparseFunctions %d\n"),
            this->scriptContext, shouldPerformSourceRundown, shouldReparseFunctions);

        Js::TempArenaAllocatorObject *tempAllocator = nullptr;
        JsUtil::List<Js::FunctionInfo *, Recycler>* pFunctionsToRegister = nullptr;
        JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer>* utf8SourceInfoList = nullptr;
        typedef JsUtil::BaseDictionary<uint32, RegSlot, ArenaAllocator, PowerOf2SizePolicy> FunctionStartToYieldRegister;

        // This container ensures that for Generator/Async functions the yield register is same between non-debug to debug parse.
        // Each entry represent a function's start position (each function will have unique start position in a file) and that function yield register
        FunctionStartToYieldRegister *yieldFunctions = nullptr;

        HRESULT hr = S_OK;
        ThreadContext* threadContext = this->scriptContext->GetThreadContext();

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        tempAllocator = threadContext->GetTemporaryAllocator(_u("debuggerAlloc"));

        utf8SourceInfoList = JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer>::New(this->scriptContext->GetRecycler());
        yieldFunctions = Anew(tempAllocator->GetAllocator(), FunctionStartToYieldRegister, tempAllocator->GetAllocator());

        this->MapUTF8SourceInfoUntil([&](Js::Utf8SourceInfo * sourceInfo) -> bool
        {
            WalkAndAddUtf8SourceInfo(sourceInfo, utf8SourceInfoList);
            return false;
        });
        END_TRANSLATE_OOM_TO_HRESULT(hr);

        if (FAILED(hr))
        {
            Assert(hr == E_OUTOFMEMORY);
            return hr;
        }

        utf8SourceInfoList->MapUntil([&](int index, Js::Utf8SourceInfo * sourceInfo) -> bool
        {
            if (this->IsSelfOrScriptContextClosed())
            {
                hr = E_FAIL;
                return true;
            }

            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::RundownSourcesAndReparse scriptContext 0x%p, sourceInfo 0x%p, HasDebugDocument %d\n"),
                this->scriptContext, sourceInfo, sourceInfo->HasDebugDocument());

            if (sourceInfo->GetIsLibraryCode())
            {
                // Not putting the internal library code to the debug mode, but need to reinitialize execution mode limits of each
                // function body upon debugger detach, even for library code at the moment.
                if (shouldReparseFunctions)
                {
                    sourceInfo->MapFunction([](Js::FunctionBody *const pFuncBody)
                    {
                        if (pFuncBody->IsFunctionParsed())
                        {
                            pFuncBody->ReinitializeExecutionModeAndLimits();
                        }
                        pFuncBody->UpdateEntryPointsOnDebugReparse();
                    });
                }

                return false;
            }

            Assert(sourceInfo->GetSrcInfo() && sourceInfo->GetSrcInfo()->sourceContextInfo);

#if DBG
            if (shouldPerformSourceRundown)
            {
                // We shouldn't have a debug document if we're running source rundown for the first time.
                Assert(!sourceInfo->HasDebugDocument());
            }
#endif // DBG

            DWORD_PTR dwDebugHostSourceContext = Js::Constants::NoHostSourceContext;

            if (shouldPerformSourceRundown && this->hostDebugContext != nullptr)
            {
                dwDebugHostSourceContext = this->hostDebugContext->GetHostSourceContext(sourceInfo);
            }

            pFunctionsToRegister = sourceInfo->GetTopLevelFunctionInfoList();

            if (pFunctionsToRegister == nullptr || pFunctionsToRegister->Count() == 0)
            {
                // This could happen if there are no functions to re-compile.
                return false;
            }

            if (this->hostDebugContext != nullptr && sourceInfo->GetSourceContextInfo())
            {
                // This call goes out of engine
                this->hostDebugContext->SetThreadDescription(sourceInfo->GetSourceContextInfo()->url); // the HRESULT is omitted.
            }

            if (shouldReparseFunctions)
            {
                yieldFunctions->Clear();
                BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                {
                    sourceInfo->MapFunction([&](Js::FunctionBody *const pFuncBody)
                    {
                        if (pFuncBody->IsCoroutine() && pFuncBody->GetYieldRegister() != Js::Constants::NoRegister)
                        {
                            yieldFunctions->Add(pFuncBody->StartInDocument(), pFuncBody->GetYieldRegister());
                        }
                    });
                }
                END_TRANSLATE_OOM_TO_HRESULT(hr);
                DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);
            }

            bool fHasDoneSourceRundown = false;
            for (int i = 0; i < pFunctionsToRegister->Count(); i++)
            {
                if (this->IsSelfOrScriptContextClosed())
                {
                    hr = E_FAIL;
                    return true;
                }

                Js::FunctionInfo *functionInfo = pFunctionsToRegister->Item(i);
                if (functionInfo == nullptr)
                {
                    continue;
                }

                if (shouldReparseFunctions)
                {
                    BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(this->scriptContext, false)
                    {
                        functionInfo->GetParseableFunctionInfo()->Parse();
                        // This is the first call to the function, ensure dynamic profile info
#if ENABLE_PROFILE_INFO
                        functionInfo->GetFunctionBody()->EnsureDynamicProfileInfo();
#endif
                    }
                    END_JS_RUNTIME_CALL_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr);

                    // Debugger attach/detach failure is catastrophic, take down the process
                    DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);
                }

                // Parsing the function may change its FunctionProxy.
                Js::ParseableFunctionInfo *parseableFunctionInfo = functionInfo->GetParseableFunctionInfo();

                if (!fHasDoneSourceRundown && shouldPerformSourceRundown && !this->IsSelfOrScriptContextClosed())
                {
                    BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                    {
                        this->RegisterFunction(parseableFunctionInfo, dwDebugHostSourceContext, parseableFunctionInfo->GetSourceName());
                    }
                    END_TRANSLATE_OOM_TO_HRESULT(hr);

                    DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);

                    fHasDoneSourceRundown = true;
                }